

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O2

bool cmAuxSourceDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *in_name;
  cmMakefile *this;
  bool bVar1;
  long lVar2;
  string *psVar3;
  Status SVar4;
  unsigned_long uVar5;
  char *__s;
  long lVar6;
  cmake *pcVar7;
  cmSourceFile *this_00;
  cmAlphaNum *this_01;
  unsigned_long dindex;
  basic_string_view<char,_std::char_traits<char>_> ext;
  string_view separator;
  string_view value;
  Directory dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmAlphaNum local_128;
  string sourceListValue;
  string file;
  cmAlphaNum local_a0;
  string tdir;
  string fullname;
  
  in_name = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)in_name;
  if (lVar2 == 0x40) {
    this = status->Makefile;
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_local_buf[0] = '\0';
    tdir._M_dataplus._M_p = (pointer)&tdir.field_2;
    tdir._M_string_length = 0;
    tdir.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&tdir);
    }
    else {
      psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      local_128.View_._M_str = (psVar3->_M_dataplus)._M_p;
      local_128.View_._M_len = psVar3->_M_string_length;
      local_a0.View_._M_str = local_a0.Digits_;
      local_a0.View_._M_len = 1;
      local_a0.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&file,&local_128,&local_a0,in_name);
      std::__cxx11::string::operator=((string *)&tdir,(string *)&file);
      std::__cxx11::string::~string((string *)&file);
    }
    cmMakefile::GetSafeDefinition
              (this,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::_M_assign((string *)&sourceListValue);
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmsys::Directory::Directory(&dir);
    SVar4 = cmsys::Directory::Load(&dir,&tdir,(string *)0x0);
    if (SVar4.Kind_ == Success) {
      uVar5 = cmsys::Directory::GetNumberOfFiles(&dir);
      for (dindex = 0; uVar5 != dindex; dindex = dindex + 1) {
        __s = cmsys::Directory::GetFile(&dir,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,__s,(allocator<char> *)&local_128);
        lVar6 = std::__cxx11::string::rfind((char)&file,0x2e);
        if (lVar6 != -1) {
          local_128.View_._M_len = file._M_string_length;
          local_128.View_._M_str = file._M_dataplus._M_p;
          ext = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_128.View_,lVar6 + 1,0xffffffffffffffff);
          pcVar7 = cmMakefile::GetCMakeInstance(this);
          if (lVar6 != 0) {
            bVar1 = cmake::FileExtensions::Test(&pcVar7->CLikeSourceFileExtensions,ext);
            if (bVar1) {
              local_128.View_._M_str = (in_name->_M_dataplus)._M_p;
              local_128.View_._M_len = in_name->_M_string_length;
              local_a0.View_._M_len = 1;
              local_a0.View_._M_str = local_a0.Digits_;
              local_a0.Digits_[0] = '/';
              cmStrCat<std::__cxx11::string>(&fullname,&local_128,&local_a0,&file);
              this_00 = cmMakefile::GetOrCreateSource(this,&fullname,false,Ambiguous);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"ABSTRACT",(allocator<char> *)&local_a0);
              cmSourceFile::SetProperty(this_00,(string *)&local_128,"0");
              std::__cxx11::string::~string((string *)&local_128);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files
                         ,&fullname);
              std::__cxx11::string::~string((string *)&fullname);
            }
          }
        }
        std::__cxx11::string::~string((string *)&file);
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (sourceListValue._M_string_length != 0) {
      std::__cxx11::string::append((char *)&sourceListValue);
    }
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin((string *)&local_128,&files,separator,(string_view)ZEXT816(0));
    std::__cxx11::string::append((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&local_128);
    value._M_str = sourceListValue._M_dataplus._M_p;
    value._M_len = sourceListValue._M_string_length;
    cmMakefile::AddDefinition
              (this,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1,value);
    cmsys::Directory::~Directory(&dir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    std::__cxx11::string::~string((string *)&tdir);
    this_01 = (cmAlphaNum *)&sourceListValue;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"called with incorrect number of arguments",
               (allocator<char> *)&local_a0);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_01 = &local_128;
  }
  std::__cxx11::string::~string((string *)this_01);
  return lVar2 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.size() != 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string sourceListValue;
  std::string const& templateDirectory = args[0];
  std::string tdir;
  if (!cmSystemTools::FileIsFullPath(templateDirectory)) {
    tdir = cmStrCat(mf.GetCurrentSourceDirectory(), '/', templateDirectory);
  } else {
    tdir = templateDirectory;
  }

  // was the list already populated
  sourceListValue = mf.GetSafeDefinition(args[1]);

  std::vector<std::string> files;

  // Load all the files in the directory
  cmsys::Directory dir;
  if (dir.Load(tdir)) {
    size_t numfiles = dir.GetNumberOfFiles();
    for (size_t i = 0; i < numfiles; ++i) {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind('.');
      if (dotpos != std::string::npos) {
        auto ext = cm::string_view(file).substr(dotpos + 1);
        // Process only source files
        auto* cm = mf.GetCMakeInstance();
        if (dotpos > 0 && cm->IsACLikeSourceExtension(ext)) {
          std::string fullname = cmStrCat(templateDirectory, '/', file);
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf = mf.GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT", "0");
          files.push_back(std::move(fullname));
        }
      }
    }
  }
  std::sort(files.begin(), files.end());
  if (!sourceListValue.empty()) {
    sourceListValue += ";";
  }
  sourceListValue += cmJoin(files, ";");
  mf.AddDefinition(args[1], sourceListValue);
  return true;
}